

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O2

void __thiscall Dumper::dumpToTty(Dumper *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  RWNode *pRVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  uint *puVar10;
  uint *puVar11;
  undefined8 *local_48;
  undefined8 *local_40;
  
  lVar7 = *(long *)(this->DDA->DDA)._M_t.
                   super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>._M_head_impl;
  puVar1 = *(undefined8 **)(lVar7 + 0x30);
  for (puVar8 = *(undefined8 **)(lVar7 + 0x28); puVar8 != puVar1; puVar8 = puVar8 + 1) {
    puVar6 = (undefined8 *)*puVar8;
    printf("=========== fun: %s ===========\n",puVar6[6]);
    puVar2 = (undefined8 *)puVar6[1];
    for (puVar6 = (undefined8 *)*puVar6; puVar6 != puVar2; puVar6 = puVar6 + 1) {
      puVar10 = (uint *)*puVar6;
      printf("<<< bblock: %u >>>\n",(ulong)*puVar10);
      puVar10 = puVar10 + 0xe;
      puVar11 = puVar10;
      while( true ) {
        puVar11 = *(uint **)puVar11;
        if (puVar11 == puVar10) break;
        pRVar3 = *(RWNode **)(puVar11 + 4);
        dumpRWNode(this,pRVar3);
        if (graph_only[0x80] == '\0') {
          lVar7 = (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3);
          if ((*(long *)(lVar7 + 0x88) != 0) && (4 < *(int *)(pRVar3 + 0x90) - 6U)) {
            plVar4 = *(long **)(this->DDA->DDA)._M_t.
                               super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                               .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>.
                               _M_head_impl;
            (**(code **)(*plVar4 + 0x20))(&local_48,plVar4,pRVar3);
            puVar5 = local_40;
            for (puVar9 = local_48; puVar9 != puVar5; puVar9 = puVar9 + 1) {
              pRVar3 = (RWNode *)*puVar9;
              printf("  <- ");
              printName(this,pRVar3);
              putchar(10);
            }
            std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~_Vector_base
                      ((_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                       &local_48);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void dumpToTty() {
        for (auto *subg : DDA->getGraph()->subgraphs()) {
            printf("=========== fun: %s ===========\n",
                   subg->getName().c_str());
            for (auto *bb : subg->bblocks()) {
                printf("<<< bblock: %u >>>\n", bb->getID());
                for (auto *node : bb->getNodes()) {
                    dumpRWNode(node);
                    if (!graph_only && node->isUse() && !node->isPhi()) {
                        for (RWNode *def : DDA->getDefinitions(node)) {
                            printf("  <- ");
                            printName(def);
                            putchar('\n');
                        }
                    }
                }
            }
        }
    }